

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O2

FileFormat InferFileFormat(string *filepath,FileFormat defaultFormat)

{
  _Base_ptr p_Var1;
  __type _Var2;
  long lVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ending;
  _Base_ptr __rhs;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  
  lVar3 = std::__cxx11::string::find_last_of((char *)filepath,0x1a0f97);
  if (lVar3 != -1) {
    ext.field_2._12_4_ = defaultFormat;
    std::__cxx11::string::substr((ulong)local_58,(ulong)filepath);
    for (p_Var4 = FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        defaultFormat = ext.field_2._12_4_,
        (_Rb_tree_header *)p_Var4 !=
        &FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      __rhs = p_Var4[1]._M_parent;
      p_Var1 = p_Var4[1]._M_left;
      while (__rhs != p_Var1) {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs);
        __rhs = __rhs + 1;
        if (_Var2) {
          defaultFormat = p_Var4[1]._M_color;
          goto LAB_00184a2d;
        }
      }
    }
LAB_00184a2d:
    std::__cxx11::string::~string((string *)local_58);
  }
  return defaultFormat;
}

Assistant:

static FileFormat InferFileFormat( const std::string& filepath, const FileFormat defaultFormat ) {
  auto pos = filepath.find_last_of( "." );
  if( pos == std::string::npos )
    return defaultFormat;

  auto ext = filepath.substr( pos + 1 );
  for( auto &ff : FileFormatEndings ) {
    for( auto &ending : ff.second ) {
      if( ext == ending )
        return ff.first;
    }
  }
  return defaultFormat;
}